

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_duplicate(_glist *x)

{
  t_selection *ptVar1;
  int iVar2;
  int iVar3;
  _binbuf *p_Var4;
  void *data;
  _instanceeditor *p_Var5;
  t_editor *ptVar6;
  int iVar7;
  int nout;
  t_selection **pptVar8;
  t_object *sink;
  t_object *src;
  
  ptVar6 = x->gl_editor;
  if (ptVar6 == (t_editor *)0x0) {
    return;
  }
  if ((ptVar6->e_selection != (t_selection *)0x0) && ((ptVar6->field_0x88 & 0x20) != 0)) {
    glist_deselectline(x);
    ptVar6 = x->gl_editor;
  }
  if ((ptVar6->field_0x88 & 0x20) != 0) {
    nout = ptVar6->e_selectline_outno;
    iVar3 = ptVar6->e_selectline_inno;
    sink = (t_object *)x->gl_list;
    iVar7 = ptVar6->e_selectline_index1 + 1;
    src = sink;
    while (iVar7 = iVar7 + -1, iVar7 != 0) {
      src = (t_object *)(src->te_g).g_next;
      if (src == (t_object *)0x0) {
        return;
      }
    }
    iVar7 = ptVar6->e_selectline_index2 + 1;
    while (iVar7 = iVar7 + -1, iVar7 != 0) {
      sink = (t_object *)(sink->te_g).g_next;
      if (sink == (t_object *)0x0) {
        return;
      }
    }
    while( true ) {
      nout = nout + 1;
      iVar7 = iVar3 + 1;
      iVar2 = canconnect(x,src,nout,sink,iVar7);
      if (iVar2 != 0) {
        iVar7 = tryconnect(x,src,nout,sink,iVar3 + 1);
        if (iVar7 == 0) {
          return;
        }
        ptVar6 = x->gl_editor;
        ptVar6->e_selectline_outno = nout;
        ptVar6->e_selectline_inno = iVar3 + 1;
        return;
      }
      if (src == (t_object *)0x0) {
        return;
      }
      iVar3 = obj_noutlets(src);
      if (iVar3 <= nout) {
        return;
      }
      if (sink == (t_object *)0x0) break;
      iVar2 = obj_ninlets(sink);
      iVar3 = iVar7;
      if (iVar2 <= iVar7) {
        return;
      }
    }
    return;
  }
  if ((ptVar6->field_0x88 & 7) != 0) {
    return;
  }
  if (ptVar6->e_selection == (t_selection *)0x0) {
    return;
  }
  if (*(_binbuf **)(pd_maininstance.pd_gui)->i_editor == (_binbuf *)0x0) {
    p_Var4 = (_binbuf *)0x0;
  }
  else {
    p_Var4 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  }
  canvas_copy(x);
  data = canvas_undo_set_paste(x,0,1,10);
  canvas_undo_add(x,UNDO_PASTE,"duplicate",data);
  canvas_dopaste(x,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  pptVar8 = &x->gl_editor->e_selection;
  while (ptVar1 = *pptVar8, ptVar1 != (t_selection *)0x0) {
    gobj_displace(ptVar1->sel_what,x,10,10);
    pptVar8 = &ptVar1->sel_next;
  }
  if (p_Var4 != (_binbuf *)0x0) {
    p_Var5 = (pd_maininstance.pd_gui)->i_editor;
    if (*(_binbuf **)p_Var5 != (_binbuf *)0x0) {
      binbuf_free(*(_binbuf **)p_Var5);
      p_Var5 = (pd_maininstance.pd_gui)->i_editor;
    }
    *(_binbuf **)p_Var5 = p_Var4;
  }
  canvas_dirty(x,1.0);
  return;
}

Assistant:

static void canvas_duplicate(t_canvas *x)
{
    if (!x->gl_editor)
        return;

    if (x->gl_editor->e_selection && x->gl_editor->e_selectedline)
        glist_deselectline(x);

        /* if a connection is selected, we extend it to the right (if possible) */
    if (x->gl_editor->e_selectedline)
    {
        int outindex = x->gl_editor->e_selectline_index1;
        int inindex  = x->gl_editor->e_selectline_index2;
        int outno = x->gl_editor->e_selectline_outno + 1;
        int inno  = x->gl_editor->e_selectline_inno + 1;
        t_gobj *outgobj = 0, *ingobj = 0;
        t_object *outobj = 0, *inobj = 0;
        int whoout = outindex;
        int whoin = inindex;

        for (outgobj = x->gl_list; whoout; outgobj = outgobj->g_next, whoout--)
            if (!outgobj->g_next) return;
        for (ingobj = x->gl_list; whoin; ingobj = ingobj->g_next, whoin--)
            if (!ingobj->g_next) return;
        outobj = (t_object*)outgobj;
        inobj = (t_object*)ingobj;

        while(!canconnect(x, outobj, outno, inobj, inno))
        {
            if (!outobj || obj_noutlets(outobj) <= outno)
                return;
            if (!inobj  || obj_ninlets (inobj ) <= inno )
                return;
            outno++;
            inno++;
        }

        if(tryconnect(x, outobj, outno, inobj, inno))
        {
            x->gl_editor->e_selectline_outno = outno;
            x->gl_editor->e_selectline_inno = inno;
        }
        return;
    }
    if (x->gl_editor->e_onmotion == MA_NONE && x->gl_editor->e_selection)
    {
        t_selection *y;
        t_binbuf*b = 0;
        if(EDITOR->copy_binbuf)
            b = binbuf_duplicate(EDITOR->copy_binbuf);
        canvas_copy(x);
        canvas_undo_add(x, UNDO_PASTE, "duplicate",
            (void *)canvas_undo_set_paste(x, 0, 1, PASTE_OFFSET));
        canvas_dopaste(x, EDITOR->copy_binbuf);
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
            gobj_displace(y->sel_what, x,
                PASTE_OFFSET, PASTE_OFFSET);
        if(b)
        {
            if(EDITOR->copy_binbuf)
                binbuf_free(EDITOR->copy_binbuf);
            EDITOR->copy_binbuf = b;
        }
        canvas_dirty(x, 1);
    }
}